

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int read_function_entry(backtrace_state *state,dwarf_data *ddata,unit *u,uintptr_t base,
                       dwarf_buf *unit_buf,line_header *lhdr,backtrace_error_callback error_callback
                       ,void *data,function_vector *vec_function,function_vector *vec_inlined)

{
  dwarf_tag dVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [8];
  uintptr_t uVar7;
  int iVar8;
  uint64_t code;
  abbrev *paVar9;
  undefined1 (*string) [16];
  function_vector *vec;
  char *pcVar10;
  undefined4 *puVar11;
  undefined8 extraout_RDX;
  long lVar12;
  ulong uVar13;
  undefined1 auStack_198 [8];
  char *s;
  undefined1 local_188 [16];
  size_t sStack_180;
  undefined1 auStack_c8 [8];
  pcrange pcrange;
  uintptr_t local_78;
  uintptr_t base_local;
  dwarf_sections *local_68;
  uintptr_t local_60;
  undefined1 local_58 [8];
  attr_val val;
  
  if (unit_buf->left != 0) {
    pcrange._48_8_ = &u->abbrevs;
    local_68 = &ddata->dwarf_sections;
    local_78 = base;
    base_local = (uintptr_t)unit_buf;
    val.u = (anon_union_8_3_08205623_for_u)state;
    do {
      code = read_uleb128(unit_buf);
      if (code == 0) {
        return 1;
      }
      paVar9 = lookup_abbrev((abbrevs *)pcrange._48_8_,code,error_callback,data);
      if (paVar9 == (abbrev *)0x0) {
        return 0;
      }
      dVar1 = paVar9->tag;
      string = (undefined1 (*) [16])0x0;
      local_60 = 0;
      vec = vec_function;
      if (((ulong)dVar1 < 0x2f) && ((0x400020000008U >> ((ulong)dVar1 & 0x3f) & 1) != 0)) {
        string = (undefined1 (*) [16])
                 tcmalloc_backtrace_alloc((backtrace_state *)val.u.string,0x28,error_callback,data);
        if (string == (undefined1 (*) [16])0x0) {
          return 0;
        }
        if (dVar1 == DW_TAG_inlined_subroutine) {
          vec = vec_inlined;
        }
        string[1] = (undefined1  [16])0x0;
        *string = (undefined1  [16])0x0;
        *(undefined8 *)string[2] = 0;
        local_60 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      }
      pcrange.have_highpc = 0;
      pcrange.highpc_is_relative = 0;
      pcrange.highpc_is_addr_index = 0;
      pcrange._36_4_ = 0;
      pcrange.have_lowpc = 0;
      pcrange.lowpc_is_addr_index = 0;
      pcrange.highpc = 0;
      _auStack_c8 = (undefined1  [16])0x0;
      pcrange.ranges = 0;
      if (paVar9->num_attrs != 0) {
        lVar12 = 0;
        bVar4 = false;
        uVar13 = 0;
        do {
          iVar8 = read_attribute(*(dwarf_form *)((long)&paVar9->attrs->form + lVar12),
                                 *(uint64_t *)((long)&paVar9->attrs->val + lVar12),
                                 (dwarf_buf *)base_local,u->is_dwarf64,u->version,u->addrsize,
                                 local_68,ddata->altlink,(attr_val *)local_58);
          if (iVar8 == 0) {
            return 0;
          }
          if (((paVar9->tag == DW_TAG_skeleton_unit) || (paVar9->tag == DW_TAG_compile_unit)) &&
             (*(int *)((long)&paVar9->attrs->name + lVar12) == 0x11)) {
            if (local_58._0_4_ == ATTR_VAL_ADDRESS_INDEX) {
              iVar8 = resolve_addr_index(local_68,u->addr_base,u->addrsize,ddata->is_bigendian,
                                         CONCAT44(val._4_4_,val.encoding),error_callback,data,
                                         &local_78);
              if (iVar8 == 0) {
                return 0;
              }
            }
            else if (local_58._0_4_ == ATTR_VAL_ADDRESS) {
              local_78 = CONCAT44(val._4_4_,val.encoding);
            }
          }
          uVar7 = base_local;
          if ((char)local_60 != '\0') {
            uVar2 = *(uint *)((long)&paVar9->attrs->name + lVar12);
            if ((int)uVar2 < 0x55) {
              if ((int)uVar2 < 0x31) {
                if (uVar2 - 0x11 < 2) {
LAB_0012c000:
                  update_pcrange((attr *)(ulong)uVar2,(attr_val *)(ulong)(uint)local_58._0_4_,
                                 (pcrange *)CONCAT44(val._4_4_,val.encoding));
                }
                else if (((uVar2 == 3) && (*(long *)*string == 0)) &&
                        (iVar8 = resolve_string(local_68,u->is_dwarf64,ddata->is_bigendian,
                                                u->str_offsets_base,(attr_val *)local_58,
                                                error_callback,data,(char **)string), iVar8 == 0)) {
                  return 0;
                }
              }
              else if (((uVar2 == 0x31) || (uVar2 == 0x47)) && (bVar5 = !bVar4, bVar4 = true, bVar5)
                      ) {
                pcVar10 = read_referenced_name_from_attr
                                    (ddata,u,(attr *)((long)&paVar9->attrs->name + lVar12),
                                     (attr_val *)local_58,error_callback,data);
                bVar4 = false;
                if (pcVar10 != (char *)0x0) {
                  *(char **)*string = pcVar10;
                }
              }
            }
            else if ((int)uVar2 < 0x59) {
              if (uVar2 == 0x55) goto LAB_0012c000;
              if ((uVar2 == 0x58) && (local_58._0_4_ == ATTR_VAL_UINT)) {
                if (lhdr->filenames_count <= CONCAT44(val._4_4_,val.encoding)) {
                  snprintf(auStack_198,200,"%s in %s at %d",
                           "invalid file number in DW_AT_call_file attribute",
                           *(undefined8 *)base_local,
                           (ulong)(uint)(*(int *)(base_local + 0x10) - *(int *)(base_local + 8)));
                  (**(code **)(uVar7 + 0x28))(*(undefined8 *)(uVar7 + 0x30),auStack_198,0);
                  return 0;
                }
                *(char **)(*string + 8) = lhdr->filenames[CONCAT44(val._4_4_,val.encoding)];
              }
            }
            else if (uVar2 == 0x59) {
              if (local_58._0_4_ == ATTR_VAL_UINT) {
                *(attr_val_encoding *)string[1] = val.encoding;
              }
            }
            else if ((uVar2 == 0x6e) || (uVar2 == 0x2007)) {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = s;
              _auStack_198 = auVar3 << 0x40;
              iVar8 = resolve_string(local_68,u->is_dwarf64,ddata->is_bigendian,u->str_offsets_base,
                                     (attr_val *)local_58,error_callback,data,(char **)auStack_198);
              if (iVar8 == 0) {
                return 0;
              }
              if (auStack_198 != (undefined1  [8])0x0) {
                *(undefined1 (*) [8])*string = auStack_198;
                bVar4 = true;
              }
            }
          }
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x10;
        } while (uVar13 < paVar9->num_attrs);
      }
      if ((char)local_60 == '\0') {
LAB_0012c1cf:
        unit_buf = (dwarf_buf *)base_local;
        if ((paVar9->has_children != 0) &&
           (iVar8 = read_function_entry((backtrace_state *)val.u.string,ddata,u,local_78,
                                        (dwarf_buf *)base_local,lhdr,error_callback,data,
                                        vec_function,vec_inlined), iVar8 == 0)) {
          return 0;
        }
      }
      else {
        if ((*(long *)*string == 0) ||
           (((int)pcrange.ranges == 0 && (((int)pcrange.lowpc == 0 || ((int)pcrange.highpc == 0)))))
           ) {
          tcmalloc_backtrace_free((backtrace_state *)val.u.string,string,0x28,error_callback,data);
          goto LAB_0012c1cf;
        }
        local_60 = local_78;
        iVar8 = add_ranges((backtrace_state *)val.u.string,local_68,
                           (libbacktrace_base_address)(ddata->base_address).m,ddata->is_bigendian,u,
                           local_78,(pcrange *)auStack_c8,add_function_range,string,error_callback,
                           data,vec);
        unit_buf = (dwarf_buf *)base_local;
        if (iVar8 == 0) {
          return 0;
        }
        if (paVar9->has_children != 0) {
          local_188 = (undefined1  [16])0x0;
          _auStack_198 = (undefined1  [16])0x0;
          iVar8 = read_function_entry((backtrace_state *)val.u.string,ddata,u,local_60,
                                      (dwarf_buf *)base_local,lhdr,error_callback,data,vec_function,
                                      (function_vector *)auStack_198);
          if (iVar8 == 0) {
            return 0;
          }
          if (sStack_180 != 0) {
            puVar11 = (undefined4 *)
                      tcmalloc_backtrace_vector_grow
                                ((backtrace_state *)val.u.string,0x18,error_callback,data,
                                 (backtrace_vector *)auStack_198);
            if (puVar11 == (undefined4 *)0x0) {
              return 0;
            }
            *puVar11 = 0xffffffff;
            puVar11[1] = 0xffffffff;
            puVar11[2] = 0xffffffff;
            puVar11[3] = 0xffffffff;
            *(undefined8 *)(puVar11 + 4) = 0;
            iVar8 = tcmalloc_backtrace_vector_release
                              ((backtrace_state *)val.u.string,(backtrace_vector *)auStack_198,
                               error_callback,data);
            if (iVar8 == 0) {
              return 0;
            }
            auVar6 = auStack_198;
            tcmalloc_backtrace_qsort((void *)auStack_198,sStack_180,0x18,function_addrs_compare);
            *(undefined1 (*) [8])(string[1] + 8) = auVar6;
            *(size_t *)string[2] = sStack_180;
          }
        }
      }
    } while (unit_buf->left != 0);
  }
  return 1;
}

Assistant:

static int
read_function_entry (struct backtrace_state *state, struct dwarf_data *ddata,
		     struct unit *u, uintptr_t base, struct dwarf_buf *unit_buf,
		     const struct line_header *lhdr,
		     backtrace_error_callback error_callback, void *data,
		     struct function_vector *vec_function,
		     struct function_vector *vec_inlined)
{
  while (unit_buf->left > 0)
    {
      uint64_t code;
      const struct abbrev *abbrev;
      int is_function;
      struct function *function;
      struct function_vector *vec;
      size_t i;
      struct pcrange pcrange;
      int have_linkage_name;

      code = read_uleb128 (unit_buf);
      if (code == 0)
	return 1;

      abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
      if (abbrev == NULL)
	return 0;

      is_function = (abbrev->tag == DW_TAG_subprogram
		     || abbrev->tag == DW_TAG_entry_point
		     || abbrev->tag == DW_TAG_inlined_subroutine);

      if (abbrev->tag == DW_TAG_inlined_subroutine)
	vec = vec_inlined;
      else
	vec = vec_function;

      function = NULL;
      if (is_function)
	{
	  function = ((struct function *)
		      backtrace_alloc (state, sizeof *function,
				       error_callback, data));
	  if (function == NULL)
	    return 0;
	  memset (function, 0, sizeof *function);
	}

      memset (&pcrange, 0, sizeof pcrange);
      have_linkage_name = 0;
      for (i = 0; i < abbrev->num_attrs; ++i)
	{
	  struct attr_val val;

	  if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			       unit_buf, u->is_dwarf64, u->version,
			       u->addrsize, &ddata->dwarf_sections,
			       ddata->altlink, &val))
	    return 0;

	  /* The compile unit sets the base address for any address
	     ranges in the function entries.  */
	  if ((abbrev->tag == DW_TAG_compile_unit
	       || abbrev->tag == DW_TAG_skeleton_unit)
	      && abbrev->attrs[i].name == DW_AT_low_pc)
	    {
	      if (val.encoding == ATTR_VAL_ADDRESS)
		base = (uintptr_t) val.u.uint;
	      else if (val.encoding == ATTR_VAL_ADDRESS_INDEX)
		{
		  if (!resolve_addr_index (&ddata->dwarf_sections,
					   u->addr_base, u->addrsize,
					   ddata->is_bigendian, val.u.uint,
					   error_callback, data, &base))
		    return 0;
		}
	    }

	  if (is_function)
	    {
	      switch (abbrev->attrs[i].name)
		{
		case DW_AT_call_file:
		  if (val.encoding == ATTR_VAL_UINT)
		    {
		      if (val.u.uint >= lhdr->filenames_count)
			{
			  dwarf_buf_error (unit_buf,
					   ("invalid file number in "
					    "DW_AT_call_file attribute"),
					   0);
			  return 0;
			}
		      function->caller_filename = lhdr->filenames[val.u.uint];
		    }
		  break;

		case DW_AT_call_line:
		  if (val.encoding == ATTR_VAL_UINT)
		    function->caller_lineno = val.u.uint;
		  break;

		case DW_AT_abstract_origin:
		case DW_AT_specification:
		  /* Second name preference: override DW_AT_name, don't override
		     DW_AT_linkage_name.  */
		  if (have_linkage_name)
		    break;
		  {
		    const char *name;

		    name
		      = read_referenced_name_from_attr (ddata, u,
							&abbrev->attrs[i], &val,
							error_callback, data);
		    if (name != NULL)
		      function->name = name;
		  }
		  break;

		case DW_AT_name:
		  /* Third name preference: don't override.  */
		  if (function->name != NULL)
		    break;
		  if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
				       ddata->is_bigendian,
				       u->str_offsets_base, &val,
				       error_callback, data, &function->name))
		    return 0;
		  break;

		case DW_AT_linkage_name:
		case DW_AT_MIPS_linkage_name:
		  /* First name preference: override all.  */
		  {
		    const char *s;

		    s = NULL;
		    if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
					 ddata->is_bigendian,
					 u->str_offsets_base, &val,
					 error_callback, data, &s))
		      return 0;
		    if (s != NULL)
		      {
			function->name = s;
			have_linkage_name = 1;
		      }
		  }
		  break;

		case DW_AT_low_pc: case DW_AT_high_pc: case DW_AT_ranges:
		  update_pcrange (&abbrev->attrs[i], &val, &pcrange);
		  break;

		default:
		  break;
		}
	    }
	}

      /* If we couldn't find a name for the function, we have no use
	 for it.  */
      if (is_function && function->name == NULL)
	{
	  backtrace_free (state, function, sizeof *function,
			  error_callback, data);
	  is_function = 0;
	}

      if (is_function)
	{
	  if (pcrange.have_ranges
	      || (pcrange.have_lowpc && pcrange.have_highpc))
	    {
	      if (!add_ranges (state, &ddata->dwarf_sections,
			       ddata->base_address, ddata->is_bigendian,
			       u, base, &pcrange, add_function_range,
			       (void *) function, error_callback, data,
			       (void *) vec))
		return 0;
	    }
	  else
	    {
	      backtrace_free (state, function, sizeof *function,
			      error_callback, data);
	      is_function = 0;
	    }
	}

      if (abbrev->has_children)
	{
	  if (!is_function)
	    {
	      if (!read_function_entry (state, ddata, u, base, unit_buf, lhdr,
					error_callback, data, vec_function,
					vec_inlined))
		return 0;
	    }
	  else
	    {
	      struct function_vector fvec;

	      /* Gather any information for inlined functions in
		 FVEC.  */

	      memset (&fvec, 0, sizeof fvec);

	      if (!read_function_entry (state, ddata, u, base, unit_buf, lhdr,
					error_callback, data, vec_function,
					&fvec))
		return 0;

	      if (fvec.count > 0)
		{
		  struct function_addrs *p;
		  struct function_addrs *faddrs;

		  /* Allocate a trailing entry, but don't include it
		     in fvec.count.  */
		  p = ((struct function_addrs *)
		       backtrace_vector_grow (state,
					      sizeof (struct function_addrs),
					      error_callback, data,
					      &fvec.vec));
		  if (p == NULL)
		    return 0;
		  p->low = 0;
		  --p->low;
		  p->high = p->low;
		  p->function = NULL;

		  if (!backtrace_vector_release (state, &fvec.vec,
						 error_callback, data))
		    return 0;

		  faddrs = (struct function_addrs *) fvec.vec.base;
		  backtrace_qsort (faddrs, fvec.count,
				   sizeof (struct function_addrs),
				   function_addrs_compare);

		  function->function_addrs = faddrs;
		  function->function_addrs_count = fvec.count;
		}
	    }
	}
    }

  return 1;
}